

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__jpeg_huff_decode(stbi__jpeg *j,stbi__huffman *h)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar2 = j->code_buffer;
  uVar6 = (ulong)h->fast[uVar2 >> 0x17];
  if (uVar6 == 0xff) {
    lVar8 = 0;
    do {
      lVar7 = lVar8;
      lVar8 = lVar7 + 1;
    } while (h->maxcode[lVar7 + 10] <= uVar2 >> 0x10);
    iVar3 = j->code_bits;
    if (lVar8 == 8) {
      j->code_bits = iVar3 + -0x10;
      uVar4 = 0xffffffff;
    }
    else {
      uVar4 = 0xffffffff;
      if ((int)(lVar7 + 10) <= iVar3) {
        iVar5 = (uVar2 >> (0x17U - (char)lVar8 & 0x1f) & stbi__bmask[lVar7 + 10]) +
                h->delta[lVar7 + 10];
        if ((uVar2 >> (-h->size[iVar5] & 0x1f) & stbi__bmask[h->size[iVar5]]) !=
            (uint)h->code[iVar5]) {
          __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                        ,0x72d,"int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)");
        }
        j->code_bits = (iVar3 - (int)lVar8) + -9;
        j->code_buffer = uVar2 << ((byte)(lVar7 + 10) & 0x1f);
        uVar4 = (uint)h->values[iVar5];
      }
    }
  }
  else {
    bVar1 = h->size[uVar6];
    uVar4 = 0xffffffff;
    if ((int)(uint)bVar1 <= j->code_bits) {
      j->code_buffer = uVar2 << (bVar1 & 0x1f);
      j->code_bits = j->code_bits - (uint)bVar1;
      uVar4 = (uint)h->values[uVar6];
    }
  }
  return uVar4;
}

Assistant:

stbi_inline static int stbi__jpeg_huff_decode(stbi__jpeg *j, stbi__huffman *h)
{
   unsigned int temp;
   int c,k;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   // look at the top FAST_BITS and determine what symbol ID it is,
   // if the code is <= FAST_BITS
   c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
   k = h->fast[c];
   if (k < 255) {
      int s = h->size[k];
      if (s > j->code_bits)
         return -1;
      j->code_buffer <<= s;
      j->code_bits -= s;
      return h->values[k];
   }

   // naive test is to shift the code_buffer down so k bits are
   // valid, then test against maxcode. To speed this up, we've
   // preshifted maxcode left so that it has (16-k) 0s at the
   // end; in other words, regardless of the number of bits, it
   // wants to be compared against something shifted to have 16;
   // that way we don't need to shift inside the loop.
   temp = j->code_buffer >> 16;
   for (k=FAST_BITS+1 ; ; ++k)
      if (temp < h->maxcode[k])
         break;
   if (k == 17) {
      // error! code not found
      j->code_bits -= 16;
      return -1;
   }

   if (k > j->code_bits)
      return -1;

   // convert the huffman code to the symbol id
   c = ((j->code_buffer >> (32 - k)) & stbi__bmask[k]) + h->delta[k];
   STBI_ASSERT((((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]);

   // convert the id to a symbol
   j->code_bits -= k;
   j->code_buffer <<= k;
   return h->values[c];
}